

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

bool __thiscall
gss::innards::HomomorphismModel::_check_degree_compatibility
          (HomomorphismModel *this,int p,int t,uint graphs_to_consider,
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *patterns_ndss,
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          *targets_ndss,bool do_not_do_nds_yet)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  pointer pIVar5;
  ulong uVar6;
  reference this_00;
  size_type sVar7;
  reference pvVar8;
  SVOBitset *this_01;
  iterator iVar9;
  iterator iVar10;
  uint in_ECX;
  long in_RDI;
  byte in_stack_00000008;
  uint y_1;
  uint y;
  uint w_1;
  SVOBitset nt_1;
  uint w;
  SVOBitset np_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_nds;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_nds;
  vector<int,_std::allocator<int>_> t_remaining;
  vector<int,_std::allocator<int>_> t_subsequence;
  vector<int,_std::allocator<int>_> p_subsequence;
  uint x;
  uint g_2;
  uint j_2;
  SVOBitset ni;
  uint g_1;
  uint j_1;
  SVOBitset nt;
  uint j;
  SVOBitset np;
  vector<int,_std::allocator<int>_> n_t;
  vector<int,_std::allocator<int>_> n_p;
  uint g;
  SVOBitset *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  value_type in_stack_fffffffffffff9f4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  SVOBitset *in_stack_fffffffffffffa08;
  SVOBitset *in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa54;
  HomomorphismModel *in_stack_fffffffffffffa58;
  uint local_484;
  uint local_480;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb98;
  NamedVertex *in_stack_fffffffffffffba0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbbc;
  Proof *in_stack_fffffffffffffbc0;
  uint local_3bc;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffca8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb0;
  NamedVertex *in_stack_fffffffffffffcb8;
  NamedVertex *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffccc;
  pointer in_stack_fffffffffffffcd0;
  pointer in_stack_fffffffffffffce0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_318 [4];
  uint local_2b4;
  uint local_2b0;
  int *local_2a8;
  int *local_2a0;
  uint local_298;
  uint local_294;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  uint local_1ec;
  uint local_198;
  uint local_194;
  uint local_104;
  uint local_100;
  uint local_38;
  byte local_31;
  uint local_1c;
  
  local_31 = in_stack_00000008 & 1;
  local_1c = in_ECX;
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x150fd9);
  bVar2 = degree_and_nds_are_preserved(pIVar5->params);
  if (bVar2) {
    for (local_38 = 0; local_38 < local_1c; local_38 = local_38 + 1) {
      uVar3 = target_degree((HomomorphismModel *)
                            CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                            (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                            (int)in_stack_fffffffffffff9e8);
      uVar4 = pattern_degree((HomomorphismModel *)
                             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                             (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                             (int)in_stack_fffffffffffff9e8);
      if (uVar3 < uVar4) {
        pIVar5 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x15106c);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
        if (bVar2) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x15108e);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x15109b);
          pattern_graph_row((HomomorphismModel *)
                            CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                            (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                            (int)in_stack_fffffffffffff9e8);
          SVOBitset::SVOBitset
                    ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                     in_stack_fffffffffffff9e8);
          for (local_100 = 0; local_100 < *(uint *)(in_RDI + 0xc); local_100 = local_100 + 1) {
            bVar2 = SVOBitset::test(in_stack_fffffffffffffa10,
                                    (int)((ulong)in_stack_fffffffffffffa08 >> 0x20));
            if (bVar2) {
              local_104 = local_100;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         (value_type_conflict1 *)in_stack_fffffffffffff9e8);
            }
          }
          target_graph_row((HomomorphismModel *)
                           CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                           (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                           (int)in_stack_fffffffffffff9e8);
          SVOBitset::SVOBitset
                    ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                     in_stack_fffffffffffff9e8);
          local_194 = SVOBitset::find_first(in_stack_fffffffffffffa08);
          while (local_194 != 0xffffffff) {
            SVOBitset::reset(in_stack_fffffffffffffa10,
                             (int)((ulong)in_stack_fffffffffffffa08 >> 0x20));
            local_198 = local_194;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       (value_type_conflict1 *)in_stack_fffffffffffff9e8);
            local_194 = SVOBitset::find_first(in_stack_fffffffffffffa08);
          }
          std::
          unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
          ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        *)0x151288);
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x151294);
          pattern_vertex_for_proof_abi_cxx11_(in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
          target_vertex_for_proof_abi_cxx11_(in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
          Proof::incompatible_by_degrees
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                     (NamedVertex *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x151329);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x151336);
          SVOBitset::~SVOBitset
                    ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
          SVOBitset::~SVOBitset
                    ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        }
        return false;
      }
      pIVar5 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x151403);
      bVar2 = degree_and_nds_are_exact
                        (pIVar5->params,*(uint *)(in_RDI + 0xc),*(uint *)(in_RDI + 0x10));
      if (bVar2) {
        uVar3 = target_degree((HomomorphismModel *)
                              CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                              (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                              (int)in_stack_fffffffffffff9e8);
        uVar4 = pattern_degree((HomomorphismModel *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                               (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                               (int)in_stack_fffffffffffff9e8);
        if (uVar3 != uVar4) {
          return false;
        }
      }
    }
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x1514a0);
    if (((pIVar5->params->no_nds & 1U) == 0) && ((local_31 & 1) == 0)) {
      std::
      vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
      ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
           (size_type)in_stack_fffffffffffff9e8);
      std::
      vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
      ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
           (size_type)in_stack_fffffffffffff9e8);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::vector<int,_std::allocator<int>_>_> *)0x1514ec);
      if (!bVar2) {
        for (local_1ec = 0; local_1ec < local_1c; local_1ec = local_1ec + 1) {
          local_208 = (undefined1  [16])0x0;
          local_1f8 = 0;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x151539);
          std::
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::
          vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
          ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::optional<std::vector<int,std::allocator<int>>>::operator=
                    ((optional<std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                     in_stack_fffffffffffff9f8);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          target_graph_row((HomomorphismModel *)
                           CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                           (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                           (int)in_stack_fffffffffffff9e8);
          SVOBitset::SVOBitset
                    ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                     in_stack_fffffffffffff9e8);
          local_294 = SVOBitset::find_first(in_stack_fffffffffffffa08);
          while (local_294 != 0xffffffff) {
            SVOBitset::reset(in_stack_fffffffffffffa10,
                             (int)((ulong)in_stack_fffffffffffffa08 >> 0x20));
            std::
            vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8);
            std::
            vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
            ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8);
            std::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)0x151669);
            local_298 = target_degree((HomomorphismModel *)
                                      CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                      (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                      (int)in_stack_fffffffffffff9e8);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       (value_type_conflict1 *)in_stack_fffffffffffff9e8);
            local_294 = SVOBitset::find_first(in_stack_fffffffffffffa08);
          }
          std::
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::
          vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
          ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                    ((optional<std::vector<int,_std::allocator<int>_>_> *)0x15177d);
          local_2a0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff9e8);
          std::
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::
          vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
          ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                    ((optional<std::vector<int,_std::allocator<int>_>_> *)0x1517d9);
          local_2a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff9e8);
          std::
          sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
                    (local_2a0,local_2a8);
          SVOBitset::~SVOBitset
                    ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        }
      }
      for (local_2b0 = 0; local_2b0 < local_1c; local_2b0 = local_2b0 + 1) {
        local_2b4 = 0;
        while( true ) {
          uVar6 = (ulong)local_2b4;
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          this_00 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         (size_type)in_stack_fffffffffffff9e8);
          sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00);
          if (sVar7 <= uVar6) break;
          std::
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::
          vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
          ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                    ((optional<std::vector<int,_std::allocator<int>_>_> *)0x1518ce);
          pvVar8 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                              (size_type)in_stack_fffffffffffff9e8);
          iVar1 = *pvVar8;
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (size_type)in_stack_fffffffffffff9e8);
          pvVar8 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                              (size_type)in_stack_fffffffffffff9e8);
          if (iVar1 < *pvVar8) {
            pIVar5 = std::
                     unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   *)0x151938);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
            if (bVar2) {
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x15195a);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x151967);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x151974);
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         0x151981);
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         0x15198e);
              this_01 = pattern_graph_row((HomomorphismModel *)
                                          CONCAT44(in_stack_fffffffffffff9f4,
                                                   in_stack_fffffffffffff9f0),
                                          (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                          (int)in_stack_fffffffffffff9e8);
              SVOBitset::SVOBitset
                        ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         in_stack_fffffffffffff9e8);
              uVar3 = SVOBitset::find_first(in_stack_fffffffffffffa08);
              local_3bc = uVar3;
              while (local_3bc != 0xffffffff) {
                SVOBitset::reset(in_stack_fffffffffffffa10,
                                 (int)((ulong)in_stack_fffffffffffffa08 >> 0x20));
                pattern_graph_row((HomomorphismModel *)
                                  CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                  (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                  (int)in_stack_fffffffffffff9e8);
                SVOBitset::count(in_stack_fffffffffffffa10);
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                emplace_back<unsigned_int&,unsigned_int>
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                           (uint *)in_stack_fffffffffffff9f8,
                           (uint *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                local_3bc = SVOBitset::find_first(in_stack_fffffffffffffa08);
              }
              target_graph_row((HomomorphismModel *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                               (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                               (int)in_stack_fffffffffffff9e8);
              SVOBitset::SVOBitset
                        ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         in_stack_fffffffffffff9e8);
              uVar4 = SVOBitset::find_first(in_stack_fffffffffffffa08);
              while (uVar4 != 0xffffffff) {
                SVOBitset::reset(in_stack_fffffffffffffa10,
                                 (int)((ulong)in_stack_fffffffffffffa08 >> 0x20));
                target_graph_row((HomomorphismModel *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                 (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                 (int)in_stack_fffffffffffff9e8);
                SVOBitset::count(in_stack_fffffffffffffa10);
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                emplace_back<unsigned_int&,unsigned_int>
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                           (uint *)in_stack_fffffffffffff9f8,
                           (uint *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                uVar4 = SVOBitset::find_first(in_stack_fffffffffffffa08);
              }
              iVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  *)in_stack_fffffffffffff9e8);
              iVar10 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)in_stack_fffffffffffff9e8);
              std::
              sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>
                        (iVar9._M_current,iVar10._M_current);
              iVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  *)in_stack_fffffffffffff9e8);
              iVar10 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)in_stack_fffffffffffff9e8);
              std::
              sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>
                        (iVar9._M_current,iVar10._M_current);
              for (local_480 = 0; local_484 = local_2b4, local_480 <= local_2b4;
                  local_480 = local_480 + 1) {
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (local_318,(ulong)local_480);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                           (value_type_conflict1 *)in_stack_fffffffffffff9f8);
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &stack0xfffffffffffffcd0,(ulong)local_480);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                           (value_type_conflict1 *)in_stack_fffffffffffff9f8);
              }
              while( true ) {
                local_484 = local_484 + 1;
                uVar6 = (ulong)local_484;
                sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                        size((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &stack0xfffffffffffffcd0);
                if (sVar7 <= uVar6) break;
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &stack0xfffffffffffffcd0,(ulong)local_484);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                           (value_type_conflict1 *)in_stack_fffffffffffff9f8);
              }
              std::
              unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            *)0x151d52);
              std::
              __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x151d5e);
              uVar4 = local_2b0;
              pattern_vertex_for_proof_abi_cxx11_((HomomorphismModel *)this_01,uVar3);
              target_vertex_for_proof_abi_cxx11_((HomomorphismModel *)this_01,uVar3);
              Proof::incompatible_by_nds
                        ((Proof *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,
                         in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                         in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                         (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0);
              std::
              pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x151df5);
              std::
              pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x151e02);
              SVOBitset::~SVOBitset
                        ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0))
              ;
              SVOBitset::~SVOBitset
                        ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0))
              ;
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         CONCAT44(uVar4,in_stack_fffffffffffffa00));
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         CONCAT44(uVar4,in_stack_fffffffffffffa00));
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(uVar4,in_stack_fffffffffffffa00));
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(uVar4,in_stack_fffffffffffffa00));
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(uVar4,in_stack_fffffffffffffa00));
            }
            return false;
          }
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x151f20);
          bVar2 = degree_and_nds_are_exact
                            (pIVar5->params,*(uint *)(in_RDI + 0xc),*(uint *)(in_RDI + 0x10));
          if (bVar2) {
            std::
            vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8);
            std::
            vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
            ::at((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8);
            std::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)0x151f70);
            pvVar8 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                (size_type)in_stack_fffffffffffff9e8);
            in_stack_fffffffffffff9f4 = *pvVar8;
            std::
            vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_type)in_stack_fffffffffffff9e8);
            pvVar8 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                (size_type)in_stack_fffffffffffff9e8);
            if (in_stack_fffffffffffff9f4 != *pvVar8) {
              return false;
            }
          }
          local_2b4 = local_2b4 + 1;
        }
      }
    }
  }
  return true;
}

Assistant:

auto HomomorphismModel::_check_degree_compatibility(
    int p,
    int t,
    unsigned graphs_to_consider,
    vector<vector<vector<int>>> & patterns_ndss,
    vector<vector<optional<vector<int>>>> & targets_ndss,
    bool do_not_do_nds_yet) const -> bool
{
    if (! degree_and_nds_are_preserved(_imp->params))
        return true;

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        if (target_degree(g, t) < pattern_degree(g, p)) {
            // not ok, degrees differ
            if (_imp->proof) {
                // get the actual neighbours of p and t, in their original terms
                vector<int> n_p, n_t;

                auto np = pattern_graph_row(g, p);
                for (unsigned j = 0; j < pattern_size; ++j)
                    if (np.test(j))
                        n_p.push_back(j);

                auto nt = target_graph_row(g, t);
                for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                    nt.reset(j);
                    n_t.push_back(j);
                }

                _imp->proof->incompatible_by_degrees(g, pattern_vertex_for_proof(p), n_p,
                    target_vertex_for_proof(t), n_t);
            }
            return false;
        }
        else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && target_degree(g, t) != pattern_degree(g, p)) {
            // not ok, degrees must be exactly the same
            return false;
        }
    }
    if (_imp->params.no_nds || do_not_do_nds_yet)
        return true;

    // full compare of neighbourhood degree sequences
    if (! targets_ndss.at(0).at(t)) {
        for (unsigned g = 0; g < graphs_to_consider; ++g) {
            targets_ndss.at(g).at(t) = vector<int>{};
            auto ni = target_graph_row(g, t);
            for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                ni.reset(j);
                targets_ndss.at(g).at(t)->push_back(target_degree(g, j));
            }
            sort(targets_ndss.at(g).at(t)->begin(), targets_ndss.at(g).at(t)->end(), greater<int>());
        }
    }

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        for (unsigned x = 0; x < patterns_ndss.at(g).at(p).size(); ++x) {
            if (targets_ndss.at(g).at(t)->at(x) < patterns_ndss.at(g).at(p).at(x)) {
                if (_imp->proof) {
                    vector<int> p_subsequence, t_subsequence, t_remaining;

                    // need to know the NDS together with the actual vertices
                    vector<pair<int, int>> p_nds, t_nds;

                    auto np = pattern_graph_row(g, p);
                    for (auto w = np.find_first(); w != decltype(np)::npos; w = np.find_first()) {
                        np.reset(w);
                        p_nds.emplace_back(w, pattern_graph_row(g, w).count());
                    }

                    auto nt = target_graph_row(g, t);
                    for (auto w = nt.find_first(); w != decltype(nt)::npos; w = nt.find_first()) {
                        nt.reset(w);
                        t_nds.emplace_back(w, target_graph_row(g, w).count());
                    }

                    sort(p_nds.begin(), p_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
                    sort(t_nds.begin(), t_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

                    for (unsigned y = 0; y <= x; ++y) {
                        p_subsequence.push_back(p_nds[y].first);
                        t_subsequence.push_back(t_nds[y].first);
                    }
                    for (unsigned y = x + 1; y < t_nds.size(); ++y)
                        t_remaining.push_back(t_nds[y].first);

                    _imp->proof->incompatible_by_nds(g, pattern_vertex_for_proof(p),
                        target_vertex_for_proof(t), p_subsequence, t_subsequence, t_remaining);
                }
                return false;
            }
            else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && targets_ndss.at(g).at(t)->at(x) != patterns_ndss.at(g).at(p).at(x))
                return false;
        }
    }

    return true;
}